

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *left,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *right)

{
  double dVar1;
  double dVar2;
  EditType EVar3;
  pointer puVar4;
  pointer puVar5;
  pointer pdVar6;
  double dVar7;
  unsigned_long uVar8;
  pointer pdVar9;
  iterator __position;
  pointer pEVar10;
  pointer pEVar11;
  EditType *pEVar12;
  undefined4 uVar13;
  long lVar14;
  pointer pEVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  best_move;
  EditType move;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  costs;
  allocator_type local_92;
  allocator_type local_91;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_90;
  pointer local_88;
  vector<double,_std::allocator<double>_> local_80;
  pointer local_68;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  puVar4 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_80,
             ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)&local_60);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,((long)puVar4 - (long)puVar5 >> 3) + 1,&local_80,&local_92);
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  puVar4 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector(&local_60,
           ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)&local_92);
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
            *)&local_80,((long)puVar4 - (long)puVar5 >> 3) + 1,&local_60,&local_91);
  if ((void *)CONCAT44(local_60.
                       super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       (EditType)
                       local_60.
                       super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                       ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_60.
                                     super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (EditType)
                                     local_60.
                                     super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
  }
  if ((long)local_48.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar14 = ((long)local_48.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    lVar17 = 0;
    lVar18 = 0;
    do {
      auVar21._8_4_ = (int)((ulong)lVar18 >> 0x20);
      auVar21._0_8_ = lVar18;
      auVar21._12_4_ = 0x45300000;
      **(double **)
        ((long)&((local_48.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_start + lVar17) =
           (auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0);
      **(undefined4 **)
        ((long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar17) = 2;
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0x18;
    } while (lVar14 + (ulong)(lVar14 == 0) != lVar18);
  }
  pdVar6 = ((local_48.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar16 = (long)((local_48.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
  if (1 < uVar16) {
    dVar7 = *local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar19 = 1;
    do {
      auVar22._8_4_ = (int)(uVar19 >> 0x20);
      auVar22._0_8_ = uVar19;
      auVar22._12_4_ = 0x45300000;
      pdVar6[uVar19] =
           (auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0);
      *(undefined4 *)((long)dVar7 + uVar19 * 4) = 1;
      uVar19 = uVar19 + 1;
    } while (uVar16 != uVar19);
  }
  local_88 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_68 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  lVar14 = (long)local_68 - (long)local_88 >> 3;
  if (local_68 != local_88) {
    puVar4 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    lVar17 = (long)puVar5 - (long)puVar4 >> 3;
    lVar18 = 0;
    do {
      if (puVar5 != puVar4) {
        uVar8 = local_88[lVar18];
        lVar20 = 0;
        do {
          if (uVar8 == puVar4[lVar20]) {
            local_48.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar18 + 1].
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar20 + 1] =
                 local_48.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar18].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar20];
            uVar13 = 0;
          }
          else {
            pdVar6 = local_48.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar18 + 1].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar7 = pdVar6[lVar20];
            pdVar9 = local_48.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar18].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar1 = pdVar9[lVar20];
            dVar2 = pdVar9[lVar20 + 1];
            if ((dVar2 <= dVar7) || (dVar1 <= dVar7)) {
              if ((dVar7 <= dVar2) || (dVar1 <= dVar2)) {
                pdVar6[lVar20 + 1] = dVar1 + 1.00001;
                uVar13 = 3;
              }
              else {
                pdVar6[lVar20 + 1] = dVar2 + 1.0;
                uVar13 = 2;
              }
            }
            else {
              pdVar6[lVar20 + 1] = dVar7 + 1.0;
              uVar13 = 1;
            }
          }
          *(undefined4 *)
           ((long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(lVar18 + 1) * 3] + 4 + lVar20 * 4) = uVar13;
          lVar20 = lVar20 + 1;
        } while (lVar17 + (ulong)(lVar17 == 0) != lVar20);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar14 + (ulong)(lVar14 == 0));
  }
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_90 = right;
  if (puVar5 != puVar4 || local_68 != local_88) {
    lVar17 = (long)puVar5 - (long)puVar4 >> 3;
    do {
      local_60.
      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           *(EditType *)
            ((long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14 * 3] + lVar17 * 4);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
        ::_M_realloc_insert<testing::internal::edit_distance::EditType_const&>
                  ((vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
                    *)__return_storage_ptr__,__position,(EditType *)&local_60);
      }
      else {
        *__position._M_current =
             (EditType)
             local_60.
             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->
        super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar14 = lVar14 - (ulong)((EditType)
                                local_60.
                                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                ._M_impl.super__Vector_impl_data._M_start != kAdd);
      lVar17 = lVar17 - (ulong)((EditType)
                                local_60.
                                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                ._M_impl.super__Vector_impl_data._M_start != kRemove);
    } while (lVar14 != 0 || lVar17 != 0);
  }
  pEVar10 = (__return_storage_ptr__->
            super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar11 = (__return_storage_ptr__->
            super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pEVar15 = pEVar11 + -1;
  if (pEVar10 < pEVar15 && pEVar10 != pEVar11) {
    do {
      pEVar12 = pEVar10 + 1;
      EVar3 = *pEVar10;
      *pEVar10 = *pEVar15;
      *pEVar15 = EVar3;
      pEVar15 = pEVar15 + -1;
      pEVar10 = pEVar12;
    } while (pEVar12 < pEVar15);
  }
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::~vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             *)&local_80);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(const std::vector<size_t>& left,
                                            const std::vector<size_t>& right) {
  std::vector<std::vector<double> > costs(
      left.size() + 1, std::vector<double>(right.size() + 1));
  std::vector<std::vector<EditType> > best_move(
      left.size() + 1, std::vector<EditType>(right.size() + 1));

  // Populate for empty right.
  for (size_t l_i = 0; l_i < costs.size(); ++l_i) {
    costs[l_i][0] = static_cast<double>(l_i);
    best_move[l_i][0] = kRemove;
  }
  // Populate for empty left.
  for (size_t r_i = 1; r_i < costs[0].size(); ++r_i) {
    costs[0][r_i] = static_cast<double>(r_i);
    best_move[0][r_i] = kAdd;
  }

  for (size_t l_i = 0; l_i < left.size(); ++l_i) {
    for (size_t r_i = 0; r_i < right.size(); ++r_i) {
      if (left[l_i] == right[r_i]) {
        // Found a match. Consume it.
        costs[l_i + 1][r_i + 1] = costs[l_i][r_i];
        best_move[l_i + 1][r_i + 1] = kMatch;
        continue;
      }

      const double add = costs[l_i + 1][r_i];
      const double remove = costs[l_i][r_i + 1];
      const double replace = costs[l_i][r_i];
      if (add < remove && add < replace) {
        costs[l_i + 1][r_i + 1] = add + 1;
        best_move[l_i + 1][r_i + 1] = kAdd;
      } else if (remove < add && remove < replace) {
        costs[l_i + 1][r_i + 1] = remove + 1;
        best_move[l_i + 1][r_i + 1] = kRemove;
      } else {
        // We make replace a little more expensive than add/remove to lower
        // their priority.
        costs[l_i + 1][r_i + 1] = replace + 1.00001;
        best_move[l_i + 1][r_i + 1] = kReplace;
      }
    }
  }

  // Reconstruct the best path. We do it in reverse order.
  std::vector<EditType> best_path;
  for (size_t l_i = left.size(), r_i = right.size(); l_i > 0 || r_i > 0;) {
    EditType move = best_move[l_i][r_i];
    best_path.push_back(move);
    l_i -= move != kAdd;
    r_i -= move != kRemove;
  }
  std::reverse(best_path.begin(), best_path.end());
  return best_path;
}